

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

uint32_t djb2_hash(char *str)

{
  uint32_t uVar1;
  
  uVar1 = 0x1505;
  while( true ) {
    if (*str == '\0') break;
    uVar1 = uVar1 * 0x21 + (int)*str;
    str = str + 1;
  }
  return uVar1;
}

Assistant:

uint32_t djb2_hash(const char *str)
{
	uint32_t hash = 5381;
	int c = *str;

	while (c)
	{
		hash = ((hash << 5) + hash) + c; /* hash * 33 + c */
		c = *++str;
	}

	return hash;
}